

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open_address_hash.c
# Opt level: O3

void oah_print(ion_hashmap_t *hash_map,int size,ion_record_info_t *record)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  long lVar6;
  
  puts("Printing map");
  if (0 < size) {
    uVar5 = 0;
    do {
      printf("%d -- %i ",(ulong)uVar5,
             (ulong)(uint)(int)hash_map->entry
                               [(int)((record->key_size + record->value_size + 1) * uVar5)]);
      iVar1 = record->key_size;
      iVar2 = record->value_size;
      if (hash_map->entry[(int)((iVar1 + iVar2 + 1) * uVar5)] == -1) {
        printf("(null)");
      }
      else {
        uVar3 = iVar2 + iVar1;
        uVar4 = (ulong)uVar3;
        if (uVar3 != 0 && SCARRY4(iVar2,iVar1) == (int)uVar3 < 0) {
          lVar6 = 0;
          do {
            printf("%X ",(ulong)(byte)hash_map->entry
                                      [lVar6 + 1 + (long)(int)(((int)uVar4 + 1) * uVar5)]);
            lVar6 = lVar6 + 1;
            uVar4 = (long)record->value_size + (long)record->key_size;
          } while (lVar6 < (long)uVar4);
        }
      }
      putchar(10);
      uVar5 = uVar5 + 1;
    } while (uVar5 != size);
  }
  return;
}

Assistant:

void
oah_print(
	ion_hashmap_t		*hash_map,
	int					size,
	ion_record_info_t	*record
) {
	int i;

	printf("Printing map\n");

	for (i = 0; i < size; i++) {
		printf("%d -- %i ", i, ((ion_hash_bucket_t *) ((hash_map->entry + (record->key_size + record->value_size + SIZEOF(STATUS)) * i)))->status);
		{
			if (((ion_hash_bucket_t *) ((hash_map->entry + (record->key_size + record->value_size + SIZEOF(STATUS)) * i)))->status == (ION_EMPTY | ION_DELETED)) {
				printf("(null)");
			}
			else {
				int j;

				for (j = 0; j < (record->key_size + record->value_size); j++) {
					printf("%X ", *(ion_byte_t *) (((ion_hash_bucket_t *) ((hash_map->entry + (record->key_size + record->value_size + SIZEOF(STATUS)) * i)))->data + j));
				}
			}

			printf("\n");
		}
	}
}